

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusArcIntersect.cpp
# Opt level: O0

int GeoCalcs::AdjustIntersects(int nIntersects,Locus *locus,LLPoint *intPt1,LLPoint *intPt2)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_110 [6];
  bool bVal2_1;
  bool bVal1_1;
  PtIsOnGeodesicResult ptResult2_1;
  PtIsOnGeodesicResult ptResult1_1;
  undefined1 local_98 [6];
  bool bVal2;
  bool bVal1;
  PtIsOnGeodesicResult ptResult2;
  PtIsOnGeodesicResult ptResult1;
  LLPoint *intPt2_local;
  LLPoint *intPt1_local;
  Locus *locus_local;
  int nIntersects_local;
  
  if (nIntersects == 0) {
    locus_local._4_4_ = 0;
  }
  else {
    locus_local._0_4_ = nIntersects;
    if (nIntersects == 1) {
      PTISONGEODESIC_RESULT::PTISONGEODESIC_RESULT((PTISONGEODESIC_RESULT *)&ptResult2.lengthCode);
      PTISONGEODESIC_RESULT::PTISONGEODESIC_RESULT((PTISONGEODESIC_RESULT *)local_98);
      bVar1 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt1,0,
                             (PtIsOnGeodesicResult *)&ptResult2.lengthCode);
      bVar2 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt2,0,
                             (PtIsOnGeodesicResult *)local_98);
      if ((bVar1) && (bVar2)) {
        if (ptResult1.geoPt.longitude._4_4_ == 0) {
          intPt1->latitude = intPt2->latitude;
          intPt1->longitude = intPt2->longitude;
        }
      }
      else if ((bVar2) && (ptResult2.geoPt.longitude._4_4_ != 0)) {
        intPt1->latitude = intPt2->latitude;
        intPt1->longitude = intPt2->longitude;
      }
      else if ((bVar1) && (ptResult1.geoPt.longitude._4_4_ == 0)) {
        locus_local._0_4_ = 0;
      }
    }
    else if (nIntersects == 2) {
      PTISONGEODESIC_RESULT::PTISONGEODESIC_RESULT((PTISONGEODESIC_RESULT *)&ptResult2_1.lengthCode)
      ;
      PTISONGEODESIC_RESULT::PTISONGEODESIC_RESULT((PTISONGEODESIC_RESULT *)local_110);
      bVar1 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt1,0,
                             (PtIsOnGeodesicResult *)&ptResult2_1.lengthCode);
      bVar2 = PtIsOnGeodesic(&locus->locusStart,&locus->locusEnd,intPt2,0,
                             (PtIsOnGeodesicResult *)local_110);
      if ((bVar1) || (bVar2)) {
        if ((!bVar1) || (bVar2)) {
          if (bVar1) {
            if ((ptResult1_1.geoPt.longitude._4_4_ == 0) && (ptResult2_1.geoPt.longitude._4_4_ != 0)
               ) {
              locus_local._0_4_ = 1;
              intPt1->latitude = intPt2->latitude;
              intPt1->longitude = intPt2->longitude;
            }
            else if ((ptResult1_1.geoPt.longitude._4_4_ != 0) &&
                    (ptResult2_1.geoPt.longitude._4_4_ == 0)) {
              locus_local._0_4_ = 1;
            }
          }
          else {
            if (ptResult2_1.geoPt.longitude._4_4_ != 0) {
              intPt1->latitude = intPt2->latitude;
              intPt1->longitude = intPt2->longitude;
            }
            locus_local._0_4_ = (uint)(ptResult2_1.geoPt.longitude._4_4_ != 0);
          }
        }
        else {
          locus_local._0_4_ = (uint)(ptResult1_1.geoPt.longitude._4_4_ != 0);
        }
      }
      else {
        locus_local._0_4_ = 0;
      }
    }
    locus_local._4_4_ = (uint)locus_local;
  }
  return locus_local._4_4_;
}

Assistant:

int AdjustIntersects(int nIntersects, const Locus &locus, LLPoint &intPt1, LLPoint &intPt2)
    {
        switch (nIntersects)
        {
            case 0:
                return 0;
            case 1:
            {
                PtIsOnGeodesicResult ptResult1, ptResult2;
                const bool bVal1 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt1, 0, ptResult1);
                const bool bVal2 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt2, 0, ptResult2);
                if (bVal1 && bVal2)
                {
                    if (!ptResult1.result)
                    {
                        intPt1 = intPt2;
                    }
                }
                else if (bVal2 && ptResult2.result)
                {
                    intPt1 = intPt2;
                }
                else if (bVal1 && !ptResult1.result)
                {
                    nIntersects--;
                }
                break;
            }
            case 2:
            {
                PtIsOnGeodesicResult ptResult1, ptResult2;
                const bool bVal1 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt1, 0, ptResult1);
                const bool bVal2 = PtIsOnGeodesic(locus.locusStart, locus.locusEnd, intPt2, 0, ptResult2);
                if (!bVal1 && !bVal2)
                    nIntersects = 0;
                else if (bVal1 && !bVal2)
                {
                    nIntersects = 1;
                    if (!ptResult1.result)
                        nIntersects = 0;
                }
                else if (!bVal1) // && bVal2)
                {
                    nIntersects = 1;
                    if (!ptResult2.result)
                        nIntersects = 0;
                    else
                    {
                        intPt1 = intPt2;
                    }
                }
                else
                {
                    if (!ptResult1.result && ptResult2.result)
                    {
                        nIntersects = 1;
                        intPt1 = intPt2;
                    }
                    else if (ptResult1.result && !ptResult2.result)
                    {
                        nIntersects = 1;
                    }
                }
                break;
            }
            default:
                break;
        }
        return nIntersects;
    }